

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void SortByDistance(int *aIdx,int nIdx,RtreeDValue *aDistance,int *aSpare)

{
  int *aIdx_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint nIdx_00;
  int nIdx_01;
  
  if (1 < nIdx) {
    nIdx_00 = (uint)nIdx >> 1;
    nIdx_01 = nIdx - nIdx_00;
    aIdx_00 = aIdx + nIdx_00;
    SortByDistance(aIdx,nIdx_00,aDistance,aSpare);
    SortByDistance(aIdx_00,nIdx_01,aDistance,aSpare);
    memcpy(aSpare,aIdx,(ulong)nIdx_00 * 4);
    uVar3 = 0;
    iVar2 = 0;
    do {
      if (uVar3 == nIdx_00) {
        aIdx[(int)(iVar2 + nIdx_00)] = aIdx_00[iVar2];
        uVar3 = nIdx_00;
        iVar2 = iVar2 + 1;
      }
      else {
        iVar1 = aSpare[uVar3];
        if (iVar2 == nIdx_01) {
          aIdx[(int)(uVar3 + nIdx_01)] = iVar1;
          uVar3 = uVar3 + 1;
          iVar2 = nIdx_01;
        }
        else if (aDistance[aIdx_00[iVar2]] < aDistance[iVar1] ||
                 aDistance[aIdx_00[iVar2]] == aDistance[iVar1]) {
          aIdx[(int)(uVar3 + iVar2)] = aIdx_00[iVar2];
          iVar2 = iVar2 + 1;
        }
        else {
          aIdx[(int)(uVar3 + iVar2)] = iVar1;
          uVar3 = uVar3 + 1;
        }
      }
    } while (iVar2 < nIdx_01 || (int)uVar3 < (int)nIdx_00);
  }
  return;
}

Assistant:

static void SortByDistance(
  int *aIdx, 
  int nIdx, 
  RtreeDValue *aDistance, 
  int *aSpare
){
  if( nIdx>1 ){
    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDistance(aLeft, nLeft, aDistance, aSpare);
    SortByDistance(aRight, nRight, aDistance, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;

    while( iLeft<nLeft || iRight<nRight ){
      if( iLeft==nLeft ){
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }else if( iRight==nRight ){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        RtreeDValue fLeft = aDistance[aLeft[iLeft]];
        RtreeDValue fRight = aDistance[aRight[iRight]];
        if( fLeft<fRight ){
          aIdx[iLeft+iRight] = aLeft[iLeft];
          iLeft++;
        }else{
          aIdx[iLeft+iRight] = aRight[iRight];
          iRight++;
        }
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue left = aDistance[aIdx[jj-1]];
        RtreeDValue right = aDistance[aIdx[jj]];
        assert( left<=right );
      }
    }
#endif
  }
}